

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void nng_system_logger(nng_log_level level,nng_log_facility facility,char *msgid,char *msg)

{
  nng_log_level __pri;
  
  __pri = NNG_LOG_INFO;
  if (level - NNG_LOG_ERR < 5) {
    __pri = level;
  }
  switch(facility) {
  case NNG_LOG_USER:
    __pri = __pri | 8;
    break;
  case NNG_LOG_DAEMON:
    __pri = __pri | 0x18;
    break;
  case NNG_LOG_AUTH:
    __pri = __pri | 0x50;
    break;
  case NNG_LOG_LOCAL0:
    __pri = __pri | 0x80;
    break;
  case NNG_LOG_LOCAL1:
    __pri = __pri | 0x88;
    break;
  case NNG_LOG_LOCAL2:
    __pri = __pri | 0x90;
    break;
  case NNG_LOG_LOCAL3:
    __pri = __pri | 0x98;
    break;
  case NNG_LOG_LOCAL4:
    __pri = __pri | 0xa0;
    break;
  case NNG_LOG_LOCAL5:
    __pri = __pri | 0xa8;
    break;
  case NNG_LOG_LOCAL6:
    __pri = __pri | 0xb0;
    break;
  case NNG_LOG_LOCAL7:
    __pri = __pri | 0xb8;
  }
  if (msgid != (char *)0x0) {
    syslog(__pri,"%s: %s");
    return;
  }
  syslog(__pri,"%s",msg);
  return;
}

Assistant:

void
nng_system_logger(nng_log_level level, nng_log_facility facility,
    const char *msgid, const char *msg)
{
#ifdef NNG_HAVE_SYSLOG
	int pri;
	switch (level) {
	case NNG_LOG_ERR:
		pri = LOG_ERR;
		break;
	case NNG_LOG_WARN:
		pri = LOG_WARNING;
		break;
	case NNG_LOG_NOTICE:
		pri = LOG_NOTICE;
		break;
	case NNG_LOG_INFO:
		pri = LOG_INFO;
		break;
	case NNG_LOG_DEBUG:
		pri = LOG_DEBUG;
		break;
	default:
		pri = LOG_INFO;
		break;
	}
	switch (facility) {
	case NNG_LOG_DAEMON:
		pri |= LOG_DAEMON;
		break;
	case NNG_LOG_USER:
		pri |= LOG_USER;
		break;
	case NNG_LOG_AUTH:
		pri |= LOG_AUTHPRIV;
		break;
	case NNG_LOG_LOCAL0:
		pri |= LOG_LOCAL0;
		break;
	case NNG_LOG_LOCAL1:
		pri |= LOG_LOCAL1;
		break;
	case NNG_LOG_LOCAL2:
		pri |= LOG_LOCAL2;
		break;
	case NNG_LOG_LOCAL3:
		pri |= LOG_LOCAL3;
		break;
	case NNG_LOG_LOCAL4:
		pri |= LOG_LOCAL4;
		break;
	case NNG_LOG_LOCAL5:
		pri |= LOG_LOCAL5;
		break;
	case NNG_LOG_LOCAL6:
		pri |= LOG_LOCAL6;
		break;
	case NNG_LOG_LOCAL7:
		pri |= LOG_LOCAL7;
		break;
	}

	if (msgid) {
		syslog(pri, "%s: %s", msgid, msg);
	} else {
		syslog(pri, "%s", msg);
	}
#else
	// everyone else just goes to stderr for now
	nng_stderr_logger(level, facility, msgid, msg);
#endif
}